

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_Vector4ApplyMatrix(float *vec4,float *matrix_4x4)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float w;
  float z;
  float y;
  float x;
  float *matrix_4x4_local;
  float *vec4_local;
  
  fVar1 = matrix_4x4[0xc] * vec4[3] +
          matrix_4x4[8] * vec4[2] + *matrix_4x4 * *vec4 + matrix_4x4[4] * vec4[1];
  fVar2 = matrix_4x4[0xd] * vec4[3] +
          matrix_4x4[9] * vec4[2] + matrix_4x4[1] * *vec4 + matrix_4x4[5] * vec4[1];
  fVar3 = matrix_4x4[0xe] * vec4[3] +
          matrix_4x4[10] * vec4[2] + matrix_4x4[2] * *vec4 + matrix_4x4[6] * vec4[1];
  fVar4 = matrix_4x4[0xf] * vec4[3] +
          matrix_4x4[0xb] * vec4[2] + matrix_4x4[3] * *vec4 + matrix_4x4[7] * vec4[1];
  *vec4 = fVar1;
  vec4[1] = fVar2;
  vec4[2] = fVar3;
  vec4[3] = fVar4;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    *vec4 = fVar1 / fVar4;
    vec4[1] = fVar2 / fVar4;
    vec4[2] = fVar3 / fVar4;
    vec4[3] = 1.0;
  }
  return;
}

Assistant:

void GPU_Vector4ApplyMatrix(float* vec4, const float* matrix_4x4)
{
	float x = matrix_4x4[0] * vec4[0] + matrix_4x4[4] * vec4[1] + matrix_4x4[8] * vec4[2] + matrix_4x4[12] * vec4[3];
	float y = matrix_4x4[1] * vec4[0] + matrix_4x4[5] * vec4[1] + matrix_4x4[9] * vec4[2] + matrix_4x4[13] * vec4[3];
	float z = matrix_4x4[2] * vec4[0] + matrix_4x4[6] * vec4[1] + matrix_4x4[10] * vec4[2] + matrix_4x4[14] * vec4[3];
	float w = matrix_4x4[3] * vec4[0] + matrix_4x4[7] * vec4[1] + matrix_4x4[11] * vec4[2] + matrix_4x4[15] * vec4[3];
	
    vec4[0] = x;
    vec4[1] = y;
    vec4[2] = z;
    vec4[3] = w;
	if(w != 0.0f)
    {
        vec4[0] = x / w;
        vec4[1] = y / w;
        vec4[2] = z / w;
        vec4[3] = 1;
    }
}